

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O3

apx_size_t rmf_address_encode(uint8_t *buf,apx_size_t buf_size,uint32_t address,_Bool more_bit)

{
  uint uVar1;
  apx_size_t aVar2;
  
  aVar2 = 0;
  if ((address < 0x40000000 && (buf_size != 0 && buf != (uint8_t *)0x0)) &&
     (aVar2 = 0, (uint)(0x3fff < address) * 2 + 2 <= buf_size)) {
    uVar1 = (more_bit | 0xfffffffe) << 0x1e;
    if (0x3fff >= address) {
      uVar1 = (uint)more_bit << 0xe;
    }
    aVar2 = (uint)(0x3fff < address) * 2 + 2;
    packBE(buf,uVar1 | address,(uint8_t)aVar2);
  }
  return aVar2;
}

Assistant:

apx_size_t rmf_address_encode(uint8_t* buf, apx_size_t buf_size, uint32_t address, bool more_bit)
{
   if ((buf == NULL) || (buf_size == 0) || (address > RMF_HIGH_ADDR_MAX))
   {
      return 0; //Invalid argument
   }
   apx_size_t encoding_size = rmf_needed_encoding_size(address);
   if (encoding_size <= buf_size)
   {
      if (encoding_size == UINT16_SIZE)
      {
         uint16_t value = more_bit ? RMF_MORE_BIT_LOW_ADDR : 0u;
         value |= (uint16_t)address;
         packBE(buf, (uint32_t)value, (uint8_t) UINT16_SIZE);
      }
      else
      {
         assert(encoding_size == UINT32_SIZE);
         uint32_t value = more_bit ? (RMF_HIGH_ADDR_BIT | RMF_MORE_BIT_HIGH_ADDR) : RMF_HIGH_ADDR_BIT;
         value |= address;
         packBE(buf, value, (uint8_t)UINT32_SIZE);
      }
   }
   else
   {
      return 0u; //Not enough bytes in buffer
   }
   return encoding_size;
}